

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O1

void __thiscall Resolver::resolve(Resolver *this,String *host,uint16_t port,SharedPtr *socket)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  sockaddr *psVar4;
  addrinfo *paVar5;
  undefined6 in_register_00000012;
  int iVar6;
  SharedPtr *pSVar7;
  size_t sVar8;
  in_addr inaddr4;
  in6_addr inaddr6;
  Error local_70;
  undefined4 local_6c;
  addrinfo local_68;
  
  local_6c = (undefined4)CONCAT62(in_register_00000012,port);
  iVar6 = 2;
  iVar3 = inet_pton(2,(host->mString)._M_dataplus._M_p,&local_70);
  if (iVar3 == 1) {
    bVar1 = false;
  }
  else {
    iVar6 = 10;
    bVar2 = false;
    do {
      bVar1 = bVar2;
      if (bVar1) goto LAB_00162464;
      iVar3 = inet_pton(10,(host->mString)._M_dataplus._M_p,&local_68);
      bVar2 = true;
    } while (iVar3 != 1);
  }
  if (iVar6 == 2) {
    sVar8 = 0x10;
    psVar4 = (sockaddr *)operator_new(0x10);
    psVar4->sa_family = 0;
    psVar4->sa_data[0] = '\0';
    psVar4->sa_data[1] = '\0';
    psVar4->sa_data[2] = '\0';
    psVar4->sa_data[3] = '\0';
    psVar4->sa_data[4] = '\0';
    psVar4->sa_data[5] = '\0';
    psVar4->sa_data[6] = '\0';
    psVar4->sa_data[7] = '\0';
    psVar4->sa_data[8] = '\0';
    psVar4->sa_data[9] = '\0';
    psVar4->sa_data[10] = '\0';
    psVar4->sa_data[0xb] = '\0';
    psVar4->sa_data[0xc] = '\0';
    psVar4->sa_data[0xd] = '\0';
    *(Error *)(psVar4->sa_data + 2) = local_70;
    psVar4->sa_family = 2;
  }
  else {
    sVar8 = 0x1c;
    psVar4 = (sockaddr *)operator_new(0x1c);
    psVar4->sa_family = 0;
    psVar4->sa_data[0] = '\0';
    psVar4->sa_data[1] = '\0';
    psVar4->sa_data[2] = '\0';
    psVar4->sa_data[3] = '\0';
    psVar4->sa_data[4] = '\0';
    psVar4->sa_data[5] = '\0';
    psVar4->sa_data[6] = '\0';
    psVar4->sa_data[7] = '\0';
    psVar4->sa_data[8] = '\0';
    psVar4->sa_data[9] = '\0';
    psVar4->sa_data[10] = '\0';
    psVar4->sa_data[0xb] = '\0';
    psVar4->sa_data[0xc] = '\0';
    psVar4->sa_data[0xd] = '\0';
    *(undefined8 *)(psVar4->sa_data + 10) = 0;
    psVar4[1].sa_data[2] = '\0';
    psVar4[1].sa_data[3] = '\0';
    psVar4[1].sa_data[4] = '\0';
    psVar4[1].sa_data[5] = '\0';
    psVar4[1].sa_data[6] = '\0';
    psVar4[1].sa_data[7] = '\0';
    psVar4[1].sa_data[8] = '\0';
    psVar4[1].sa_data[9] = '\0';
    *(undefined8 *)(psVar4->sa_data + 6) = local_68._0_8_;
    *(undefined8 *)(psVar4 + 1) = local_68._8_8_;
    psVar4->sa_family = 10;
  }
  *(ushort *)psVar4->sa_data = (ushort)local_6c << 8 | (ushort)local_6c >> 8;
  this->addr = psVar4;
  this->size = sVar8;
  if (bVar1) {
LAB_00162464:
    local_68.ai_flags = 0;
    local_68.ai_family = 0;
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_socktype = 1;
    local_68.ai_protocol = 0;
    iVar3 = getaddrinfo((host->mString)._M_dataplus._M_p,(char *)0x0,&local_68,(addrinfo **)this);
    if (iVar3 == 0) {
      for (paVar5 = this->res; paVar5 != (addrinfo *)0x0; paVar5 = paVar5->ai_next) {
        if (paVar5->ai_family == 2) {
          sVar8 = 0x10;
LAB_001624db:
          psVar4 = paVar5->ai_addr;
          this->addr = psVar4;
          *(ushort *)psVar4->sa_data = (ushort)local_6c << 8 | (ushort)local_6c >> 8;
          this->size = sVar8;
          break;
        }
        if (paVar5->ai_family == 10) {
          sVar8 = 0x1c;
          goto LAB_001624db;
        }
      }
      if (this->addr == (sockaddr *)0x0) {
        local_70 = DnsError;
        pSVar7 = socket;
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
        operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                    *)&((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->mSignalError,socket,&local_70);
        SocketClient::close((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr,(int)pSVar7);
        freeaddrinfo((addrinfo *)this->res);
        this->res = (addrinfo *)0x0;
      }
    }
    else {
      local_70 = DnsError;
      pSVar7 = socket;
      Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
      operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                  *)&((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->mSignalError,socket,&local_70);
      SocketClient::close((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,(int)pSVar7);
    }
  }
  return;
}

Assistant:

void Resolver::resolve(const String& host, uint16_t port, const SocketClient::SharedPtr& socket)
{
    // first, see if this parses as an IP mAddress
    {
        struct in_addr inaddr4;
        struct in6_addr inaddr6;
        struct { int af; void* dst; } addrs[2] = {
            { AF_INET, &inaddr4 },
            { AF_INET6, &inaddr6 }
        };
        for (int i = 0; i < 2; ++i) {
            if (inet_pton(addrs[i].af, host.constData(), addrs[i].dst) == 1) {
                // yes, use that
                if (addrs[i].af == AF_INET) {
                    sockaddr_in* newaddr = new sockaddr_in;
                    memset(newaddr, '\0', sizeof(sockaddr_in));
                    memcpy(&newaddr->sin_addr, &inaddr4, sizeof(struct in_addr));
                    newaddr->sin_family = AF_INET;
                    newaddr->sin_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in);
                } else {
                    assert(addrs[i].af == AF_INET6);
                    sockaddr_in6* newaddr = new sockaddr_in6;
                    memset(newaddr, '\0', sizeof(sockaddr_in6));
                    memcpy(&newaddr->sin6_addr, &inaddr6, sizeof(struct in6_addr));
                    newaddr->sin6_family = AF_INET6;
                    newaddr->sin6_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in6);
                }
                return;
            }
        }
    }

    // not an ip mAddress, try to resolve it
    addrinfo hints, *p;

    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC; // AF_INET or AF_INET6 to force version
    hints.ai_socktype = SOCK_STREAM;

    if (getaddrinfo(host.constData(), NULL, &hints, &res) != 0) {
        // bad
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        return;
    }

    for (p = res; p; p = p->ai_next) {
        if (p->ai_family == AF_INET) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in*>(addr)->sin_port = htons(port);
            size = sizeof(sockaddr_in);
            break;
        } else if (p->ai_family == AF_INET6) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in6*>(addr)->sin6_port = htons(port);
            size = sizeof(sockaddr_in6);
            break;
        }
    }

    if (!addr) {
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        freeaddrinfo(res);
        res = 0;
        return;
    }
}